

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QColorLineEdit.cpp
# Opt level: O0

int __thiscall QColorLineEdit::qt_metacall(QColorLineEdit *this,Call _c,int _id,void **_a)

{
  undefined8 *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_stack_00000050;
  int in_stack_00000058;
  Call in_stack_0000005c;
  QObject *in_stack_00000060;
  QMetaType in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = QAbstractButtonLineEdit::qt_metacall
                      ((QAbstractButtonLineEdit *)CONCAT44(in_ESI,in_EDX),
                       (Call)((ulong)in_RCX >> 0x20),(int)in_RCX,
                       (void **)in_stack_ffffffffffffffd8.d_ptr);
  if (-1 < local_4) {
    if (in_ESI == 0) {
      if (local_4 < 2) {
        qt_static_metacall(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000050);
      }
      local_4 = local_4 + -2;
    }
    else if (in_ESI == 7) {
      if (local_4 < 2) {
        memset(&stack0xffffffffffffffd8,0,8);
        QMetaType::QMetaType((QMetaType *)&stack0xffffffffffffffd8);
        *(QMetaTypeInterface **)*in_RCX = in_stack_ffffffffffffffd8.d_ptr;
      }
      local_4 = local_4 + -2;
    }
    else if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))
            ) {
      qt_static_metacall(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000050);
      local_4 = local_4 + -4;
    }
  }
  return local_4;
}

Assistant:

int QColorLineEdit::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAbstractButtonLineEdit::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 2)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 2;
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}